

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

double Catch::Benchmark::Detail::normal_quantile(double p)

{
  int iVar1;
  double in_XMM0_Qa;
  double dVar2;
  double result;
  double local_8;
  
  if (normal_quantile(double)::ROOT_TWO == '\0') {
    iVar1 = __cxa_guard_acquire(&normal_quantile(double)::ROOT_TWO);
    if (iVar1 != 0) {
      normal_quantile::ROOT_TWO = sqrt(2.0);
      __cxa_guard_release(&normal_quantile(double)::ROOT_TWO);
    }
  }
  if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
    local_8 = 0.0;
  }
  else {
    dVar2 = erfc_inv(7.56029132579192e-318);
    local_8 = normal_quantile::ROOT_TWO * -dVar2;
  }
  return local_8;
}

Assistant:

double normal_quantile(double p) {
                static const double ROOT_TWO = std::sqrt(2.0);

                double result = 0.0;
                assert(p >= 0 && p <= 1);
                if (p < 0 || p > 1) {
                    return result;
                }

                result = -erfc_inv(2.0 * p);
                // result *= normal distribution standard deviation (1.0) * sqrt(2)
                result *= /*sd * */ ROOT_TWO;
                // result += normal disttribution mean (0)
                return result;
            }